

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O1

int ON_UuidPtr::ComparePtrAndId(ON_UuidPtr *a,ON_UuidPtr *b)

{
  int iVar1;
  
  if (a == (ON_UuidPtr *)0x0) {
    return -(uint)(b != (ON_UuidPtr *)0x0);
  }
  iVar1 = 1;
  if (b != (ON_UuidPtr *)0x0) {
    iVar1 = -1;
    if ((b->m_ptr <= a->m_ptr) && (iVar1 = 1, a->m_ptr <= b->m_ptr)) {
      iVar1 = ON_UuidCompare(&a->m_id,&b->m_id);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int ON_UuidPtr::ComparePtrAndId( const ON_UuidPtr* a, const ON_UuidPtr* b )
{
  int i;
  if ( !a )
    return (b ? -1 : 0 );
  if ( !b )
    return 1;

  if (a->m_ptr < b->m_ptr)
    i = -1;
  else if (a->m_ptr > b->m_ptr)
    i = 1;
  else
    i = ON_UuidCompare(&a->m_id,&b->m_id);

  return i;
}